

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<const_PClass_*,_const_PClass_*>::DoCopy
          (TArray<const_PClass_*,_const_PClass_*> *this,
          TArray<const_PClass_*,_const_PClass_*> *other)

{
  uint uVar1;
  PClass **ppPVar2;
  uint i;
  ulong uVar3;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (PClass **)0x0;
  }
  else {
    ppPVar2 = (PClass **)
              M_Malloc_Dbg((ulong)uVar1 << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                           ,0x19e);
    this->Array = ppPVar2;
    uVar1 = this->Count;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      this->Array[uVar3] = other->Array[uVar3];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}